

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpsourcedata.cpp
# Opt level: O2

RTPTime __thiscall jrtplib::RTPSourceData::INF_GetRoundtripTime(RTPSourceData *this)

{
  RTPNTPTime RVar1;
  RTPTime RVar2;
  RTPTime local_10;
  
  RVar2.m_t = 0.0;
  if (((this->RRinf).hasinfo == true) && ((this->RRinf).lsr != 0 || (this->RRinf).dlsr != 0)) {
    local_10.m_t = (this->RRinf).receivetime.m_t;
    RVar1 = RTPTime::GetNTPTime(&local_10);
    RVar2.m_t = (double)((RVar1.lsw >> 0x10 | RVar1.msw << 0x10) -
                        ((this->RRinf).dlsr + (this->RRinf).lsr)) * 1.52587890625e-05;
  }
  return (RTPTime)RVar2.m_t;
}

Assistant:

RTPTime RTPSourceData::INF_GetRoundtripTime() const
{
	if (!RRinf.HasInfo())
		return RTPTime(0,0);
	if (RRinf.GetDelaySinceLastSR() == 0 && RRinf.GetLastSRTimestamp() == 0)
		return RTPTime(0,0);

	RTPNTPTime recvtime = RRinf.GetReceiveTime().GetNTPTime();
	uint32_t rtt = ((recvtime.GetMSW()&0xFFFF)<<16)|((recvtime.GetLSW()>>16)&0xFFFF);
	rtt -= RRinf.GetLastSRTimestamp();
	rtt -= RRinf.GetDelaySinceLastSR();

	double drtt = (((double)rtt)/65536.0);
	return RTPTime(drtt);
}